

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbitset_unit.c
# Opt level: O3

void test_construct(void)

{
  _Bool _Var1;
  int iVar2;
  bitset_t *bitset;
  size_t sVar3;
  short sVar4;
  int k;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  
  uVar5 = 0;
  bitset = bitset_create();
  do {
    uVar6 = uVar5 >> 6;
    if (uVar6 < bitset->arraysize) {
LAB_00102845:
      bitset->array[uVar6] = bitset->array[uVar6] | 1L << ((byte)uVar5 & 0x3f);
    }
    else {
      _Var1 = bitset_grow(bitset,uVar6 + 1);
      if (_Var1) goto LAB_00102845;
    }
    uVar5 = uVar5 + 3;
    if (uVar5 == 3000) {
      iVar2 = compute_cardinality(bitset);
      _assert_true((ulong)(iVar2 == 1000),"compute_cardinality(b) == 1000",
                   "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cbitset_unit.c"
                   ,0x52);
      sVar3 = bitset_count(bitset);
      _assert_true((ulong)(sVar3 == 1000),"bitset_count(b) == 1000",
                   "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cbitset_unit.c"
                   ,0x53);
      sVar4 = 0;
      uVar5 = 0;
      do {
        if (uVar5 >> 6 < bitset->arraysize) {
          bVar7 = (bitset->array[uVar5 >> 6] >> (uVar5 & 0x3f) & 1) != 0;
        }
        else {
          bVar7 = false;
        }
        _assert_true((ulong)(byte)((short)((short)(((uint)uVar5 & 0xffff) / 3) * 3 + sVar4) != 0 ^
                                  bVar7),"bitset_get(b, k) == (k / 3 * 3 == k)",
                     "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cbitset_unit.c"
                     ,0x55);
        uVar5 = uVar5 + 1;
        sVar4 = sVar4 + -1;
      } while (uVar5 != 3000);
      bitset_free(bitset);
      return;
    }
  } while( true );
}

Assistant:

DEFINE_TEST(test_construct) {
    bitset_t *b = bitset_create();
    for (int k = 0; k < 1000; ++k) bitset_set(b, 3 * k);
    assert_true(compute_cardinality(b) == 1000);
    assert_true(bitset_count(b) == 1000);
    for (int k = 0; k < 3 * 1000; ++k)
        assert_true(bitset_get(b, k) == (k / 3 * 3 == k));
    bitset_free(b);
}